

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_node_t mpack_tree_root(mpack_tree_t *tree)

{
  mpack_node_data_t *pmVar1;
  mpack_node_t mVar2;
  
  if (tree->error == mpack_ok) {
    if (tree->parsed != false) {
      pmVar1 = tree->root;
      goto LAB_00107807;
    }
    mpack_tree_flag_error(tree,mpack_error_bug);
  }
  pmVar1 = &tree->nil_node;
LAB_00107807:
  mVar2.tree = tree;
  mVar2.data = pmVar1;
  return mVar2;
}

Assistant:

mpack_node_t mpack_tree_root(mpack_tree_t* tree) {
    if (mpack_tree_error(tree) != mpack_ok)
        return mpack_tree_nil_node(tree);

    // We check that mpack_tree_parse() was called at least once, and
    // assert if not. This is to facilitate the transition to requiring
    // a call to mpack_tree_parse(), since it used to be automatic on
    // initialization.
    if (!tree->parsed) {
        mpack_break("Tree has not been parsed! You must call mpack_tree_parse()"
                " after initialization before accessing the root node.");
        mpack_tree_flag_error(tree, mpack_error_bug);
        return mpack_tree_nil_node(tree);
    }

    return mpack_node(tree, tree->root);
}